

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O3

void __thiscall antlr::CharScanner::append(CharScanner *this,char c)

{
  ulong uVar1;
  undefined1 local_11;
  
  if (this->saveConsumedInput == true) {
    uVar1 = (this->text)._M_string_length;
    if ((char)uVar1 == '\0') {
      std::__cxx11::string::reserve((ulong)&this->text);
    }
    std::__cxx11::string::replace((ulong)&this->text,uVar1,(char *)0x0,(ulong)&local_11);
  }
  return;
}

Assistant:

virtual void append(char c)
	{
		if (saveConsumedInput)
		{
			size_t l = text.length();

			if ((l%256) == 0)
				text.reserve(l+256);

			text.replace(l,0,&c,1);
		}
	}